

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  ushort *puVar1;
  Descriptor *message_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>_>
  this_00;
  int i;
  int iVar2;
  java *pjVar3;
  undefined1 in_R8B;
  string_view input;
  string_view input_00;
  OneofDescriptor *oneof;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  OneofGeneratorInfo info;
  string local_50;
  
  for (iVar2 = 0; iVar2 < message->nested_type_count_; iVar2 = iVar2 + 1) {
    message_00 = Descriptor::nested_type(message,iVar2);
    InitializeFieldGeneratorInfoForMessage(this,message_00);
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(&fields,(long)message->field_count_);
  for (iVar2 = 0; iVar2 < message->field_count_; iVar2 = iVar2 + 1) {
    info.name._M_dataplus._M_p = (pointer)Descriptor::field(message,iVar2);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::emplace_back<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&fields,(FieldDescriptor **)&info);
  }
  InitializeFieldGeneratorInfoForFields(this,&fields);
  for (iVar2 = 0; iVar2 < message->oneof_decl_count_; iVar2 = iVar2 + 1) {
    oneof = Descriptor::oneof_decl(message,iVar2);
    info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
    info.name._M_string_length = 0;
    info.name.field_2._M_local_buf[0] = '\0';
    info.capitalized_name._M_dataplus._M_p = (pointer)&info.capitalized_name.field_2;
    info.capitalized_name._M_string_length = 0;
    info.capitalized_name.field_2._M_local_buf[0] = '\0';
    puVar1 = (ushort *)(oneof->all_names_).payload_;
    pjVar3 = (java *)(ulong)*puVar1;
    input._M_len = (long)puVar1 + ~(ulong)pjVar3;
    input._M_str = (char *)0x0;
    UnderscoresToCamelCase_abi_cxx11_(&local_50,pjVar3,input,(bool)in_R8B);
    std::__cxx11::string::operator=((string *)&info,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    puVar1 = (ushort *)(oneof->all_names_).payload_;
    pjVar3 = (java *)(ulong)*puVar1;
    input_00._M_len = (long)puVar1 + ~(ulong)pjVar3;
    input_00._M_str = (char *)0x1;
    UnderscoresToCamelCase_abi_cxx11_(&local_50,pjVar3,input_00,(bool)in_R8B);
    std::__cxx11::string::operator=((string *)&info.capitalized_name,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
              ::
              operator[]<google::protobuf::OneofDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
                          *)&this->oneof_generator_info_map_,&oneof);
    OneofGeneratorInfo::operator=(this_00,&info);
    OneofGeneratorInfo::~OneofGeneratorInfo(&info);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  fields.reserve(message->field_count());
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}